

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
          (RawUpdateRegistry *this,VkDescriptorImageInfo *updateObject)

{
  deUint64 *pdVar1;
  iterator __position;
  pointer puVar2;
  size_t sVar3;
  deUint64 dVar4;
  
  __position._M_current =
       (this->m_updateEntryOffsets).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_updateEntryOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_updateEntryOffsets,
               __position,&this->m_nextOffset);
  }
  else {
    *__position._M_current = this->m_nextOffset;
    (this->m_updateEntryOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_updateEntries,this->m_nextOffset + 0x18);
  puVar2 = (this->m_updateEntries).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = this->m_nextOffset;
  *(VkImageLayout *)(puVar2 + sVar3 + 0x10) = updateObject->imageLayout;
  dVar4 = (updateObject->imageView).m_internal;
  pdVar1 = (deUint64 *)(puVar2 + sVar3);
  *pdVar1 = (updateObject->sampler).m_internal;
  pdVar1[1] = dVar4;
  this->m_nextOffset = this->m_nextOffset + 0x18;
  return;
}

Assistant:

void RawUpdateRegistry::addWriteObject (const Type& updateObject)
{
	m_updateEntryOffsets.push_back(m_nextOffset);

	// in this case, elements <=> bytes
	m_updateEntries.resize(m_nextOffset + sizeof(updateObject));
	Type* t = reinterpret_cast<Type*>(m_updateEntries.data() + m_nextOffset);
	*t = updateObject;
	m_nextOffset += sizeof(updateObject);
}